

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O0

void av1_convolve_y_sr_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined2 uVar16;
  int in_ECX;
  undefined4 *in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  __m128i *extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  __m128i *extraout_XMM0_Qb;
  __m128i *extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined1 auVar17 [16];
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  long in_stack_00000008;
  int i;
  uint8_t *data;
  __m128i res_1;
  __m128i res16_1;
  __m128i res_hi_round;
  __m128i res_lo_round;
  __m128i res_hi;
  __m128i res_lo;
  __m128i src6_1;
  __m128i s_1 [8];
  int j;
  int res_int;
  __m128i res16;
  __m128i res_round;
  __m128i res;
  __m128i src6;
  __m128i s [8];
  __m128i coeffs [4];
  __m128i round_shift;
  __m128i round_const;
  uint8_t *src_ptr;
  int fo_vert;
  undefined8 in_stack_fffffffffffff5f0;
  undefined8 in_stack_fffffffffffff5f8;
  uint8_t *in_stack_fffffffffffff600;
  undefined8 in_stack_fffffffffffff608;
  __m128i *in_stack_fffffffffffff610;
  __m128i *in_stack_fffffffffffff618;
  __m128i *s_00;
  InterpFilterParams *in_stack_fffffffffffff620;
  int in_stack_fffffffffffff628;
  int local_994;
  int local_890;
  __m128i *palStack_850;
  undefined8 in_stack_fffffffffffff7d0;
  undefined8 in_stack_fffffffffffff7d8;
  uint8_t *in_stack_fffffffffffff7e0;
  undefined8 in_stack_fffffffffffff7e8;
  uint8_t *in_stack_fffffffffffff7f0;
  void *local_760;
  int local_754;
  undefined4 *local_748;
  ulong local_728;
  int local_438;
  int iStack_434;
  int iStack_430;
  int iStack_42c;
  int local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int local_3f8;
  int iStack_3f4;
  int iStack_3f0;
  int iStack_3ec;
  int local_3d8;
  int iStack_3d4;
  int iStack_3d0;
  int iStack_3cc;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int local_398;
  int iStack_394;
  int iStack_390;
  int iStack_38c;
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short local_258;
  short sStack_256;
  short sStack_254;
  short sStack_252;
  InterpFilterParams *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  
  if (*(ushort *)(in_stack_00000008 + 8) < 9) {
    local_760 = (void *)(in_RDI - (int)(((*(ushort *)(in_stack_00000008 + 8) >> 1) - 1) * in_ESI));
    local_728 = SUB168(ZEXT416(7),0);
    prepare_coeffs(in_stack_fffffffffffff620,(int)((ulong)in_stack_fffffffffffff618 >> 0x20),
                   in_stack_fffffffffffff610);
    if (in_R8D < 5) {
      xx_loadl_32(local_760);
      s_00 = extraout_XMM0_Qa;
      xx_loadl_32((void *)((long)local_760 + (long)in_ESI));
      xx_loadl_32((void *)((long)local_760 + (long)in_ESI));
      xx_loadl_32((void *)((long)local_760 + (long)(in_ESI * 2)));
      xx_loadl_32((void *)((long)local_760 + (long)(in_ESI * 2)));
      xx_loadl_32((void *)((long)local_760 + (long)(in_ESI * 3)));
      xx_loadl_32((void *)((long)local_760 + (long)(in_ESI * 3)));
      xx_loadl_32((void *)((long)local_760 + (long)(in_ESI << 2)));
      xx_loadl_32((void *)((long)local_760 + (long)(in_ESI << 2)));
      xx_loadl_32((void *)((long)local_760 + (long)(in_ESI * 5)));
      xx_loadl_32((void *)((long)local_760 + (long)(in_ESI * 6)));
      xx_loadl_32((void *)((long)local_760 + (long)(in_ESI * 5)));
      palStack_850 = extraout_XMM0_Qb;
      local_754 = in_R9D;
      local_748 = in_RDX;
      do {
        xx_loadl_32((void *)((long)local_760 + (long)(in_ESI * 7)));
        xx_loadl_32((void *)((long)local_760 + (long)(in_ESI << 3)));
        xx_loadl_32((void *)((long)local_760 + (long)(in_ESI * 7)));
        convolve_lo_y(s_00,palStack_850);
        local_398 = (int)extraout_XMM0_Qa_00;
        iStack_394 = (int)((ulong)extraout_XMM0_Qa_00 >> 0x20);
        iStack_390 = (int)extraout_XMM0_Qb_01;
        iStack_38c = (int)((ulong)extraout_XMM0_Qb_01 >> 0x20);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = local_728;
        uVar1 = CONCAT44(iStack_394 + 0x40 >> auVar7,local_398 + 0x40 >> auVar7);
        uVar2 = CONCAT44(iStack_38c + 0x40 >> auVar7,iStack_390 + 0x40 >> auVar7);
        auVar15._8_8_ = uVar2;
        auVar15._0_8_ = uVar1;
        auVar14._8_8_ = uVar2;
        auVar14._0_8_ = uVar1;
        auVar17 = packssdw(auVar15,auVar14);
        local_258 = auVar17._0_2_;
        sStack_256 = auVar17._2_2_;
        sStack_254 = auVar17._4_2_;
        sStack_252 = auVar17._6_2_;
        uVar16 = CONCAT11((0 < sStack_256) * (sStack_256 < 0x100) * auVar17[2] - (0xff < sStack_256)
                          ,(0 < local_258) * (local_258 < 0x100) * auVar17[0] - (0xff < local_258));
        if (in_R8D == 2) {
          *(undefined2 *)local_748 = uVar16;
        }
        else {
          *local_748 = CONCAT13((0 < sStack_252) * (sStack_252 < 0x100) * auVar17[6] -
                                (0xff < sStack_252),
                                CONCAT12((0 < sStack_254) * (sStack_254 < 0x100) * auVar17[4] -
                                         (0xff < sStack_254),uVar16));
        }
        local_748 = (undefined4 *)((long)local_748 + (long)in_ECX);
        convolve_lo_y(s_00,palStack_850);
        local_3b8 = (int)extraout_XMM0_Qa_01;
        iStack_3b4 = (int)((ulong)extraout_XMM0_Qa_01 >> 0x20);
        iStack_3b0 = (int)extraout_XMM0_Qb_02;
        iStack_3ac = (int)((ulong)extraout_XMM0_Qb_02 >> 0x20);
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_728;
        uVar1 = CONCAT44(iStack_3b4 + 0x40 >> auVar6,local_3b8 + 0x40 >> auVar6);
        uVar2 = CONCAT44(iStack_3ac + 0x40 >> auVar6,iStack_3b0 + 0x40 >> auVar6);
        auVar13._8_8_ = uVar2;
        auVar13._0_8_ = uVar1;
        auVar12._8_8_ = uVar2;
        auVar12._0_8_ = uVar1;
        auVar17 = packssdw(auVar13,auVar12);
        local_278 = auVar17._0_2_;
        sStack_276 = auVar17._2_2_;
        sStack_274 = auVar17._4_2_;
        sStack_272 = auVar17._6_2_;
        uVar16 = CONCAT11((0 < sStack_276) * (sStack_276 < 0x100) * auVar17[2] - (0xff < sStack_276)
                          ,(0 < local_278) * (local_278 < 0x100) * auVar17[0] - (0xff < local_278));
        if (in_R8D == 2) {
          *(undefined2 *)local_748 = uVar16;
        }
        else {
          *local_748 = CONCAT13((0 < sStack_272) * (sStack_272 < 0x100) * auVar17[6] -
                                (0xff < sStack_272),
                                CONCAT12((0 < sStack_274) * (sStack_274 < 0x100) * auVar17[4] -
                                         (0xff < sStack_274),uVar16));
        }
        local_760 = (void *)((long)local_760 + (long)in_ESI + (long)in_ESI);
        local_748 = (undefined4 *)((long)local_748 + (long)in_ECX);
        local_754 = local_754 + -2;
        palStack_850 = extraout_XMM0_Qb_00;
      } while (local_754 != 0);
    }
    else {
      local_890 = 0;
      do {
        local_994 = 0;
        do {
          convolve_lo_y(in_stack_fffffffffffff618,in_stack_fffffffffffff610);
          convolve_hi_y(in_stack_fffffffffffff618,in_stack_fffffffffffff610);
          local_3d8 = (int)extraout_XMM0_Qa_02;
          iStack_3d4 = (int)((ulong)extraout_XMM0_Qa_02 >> 0x20);
          iStack_3d0 = (int)extraout_XMM0_Qb_03;
          iStack_3cc = (int)((ulong)extraout_XMM0_Qb_03 >> 0x20);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_728;
          local_3f8 = (int)extraout_XMM0_Qa_03;
          iStack_3f4 = (int)((ulong)extraout_XMM0_Qa_03 >> 0x20);
          iStack_3f0 = (int)extraout_XMM0_Qb_04;
          iStack_3ec = (int)((ulong)extraout_XMM0_Qb_04 >> 0x20);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_728;
          auVar11._4_4_ = iStack_3d4 + 0x40 >> auVar5;
          auVar11._0_4_ = local_3d8 + 0x40 >> auVar5;
          auVar11._12_4_ = iStack_3cc + 0x40 >> auVar5;
          auVar11._8_4_ = iStack_3d0 + 0x40 >> auVar5;
          auVar10._4_4_ = iStack_3f4 + 0x40 >> auVar4;
          auVar10._0_4_ = local_3f8 + 0x40 >> auVar4;
          auVar10._12_4_ = iStack_3ec + 0x40 >> auVar4;
          auVar10._8_4_ = iStack_3f0 + 0x40 >> auVar4;
          auVar17 = packssdw(auVar11,auVar10);
          local_298 = auVar17._0_2_;
          sStack_296 = auVar17._2_2_;
          sStack_294 = auVar17._4_2_;
          sStack_292 = auVar17._6_2_;
          sStack_290 = auVar17._8_2_;
          sStack_28e = auVar17._10_2_;
          sStack_28c = auVar17._12_2_;
          sStack_28a = auVar17._14_2_;
          *(ulong *)((long)in_RDX + (long)local_890 + (long)(local_994 * in_ECX)) =
               CONCAT17((0 < sStack_28a) * (sStack_28a < 0x100) * auVar17[0xe] - (0xff < sStack_28a)
                        ,CONCAT16((0 < sStack_28c) * (sStack_28c < 0x100) * auVar17[0xc] -
                                  (0xff < sStack_28c),
                                  CONCAT15((0 < sStack_28e) * (sStack_28e < 0x100) * auVar17[10] -
                                           (0xff < sStack_28e),
                                           CONCAT14((0 < sStack_290) * (sStack_290 < 0x100) *
                                                    auVar17[8] - (0xff < sStack_290),
                                                    CONCAT13((0 < sStack_292) * (sStack_292 < 0x100)
                                                             * auVar17[6] - (0xff < sStack_292),
                                                             CONCAT12((0 < sStack_294) *
                                                                      (sStack_294 < 0x100) *
                                                                      auVar17[4] -
                                                                      (0xff < sStack_294),
                                                                      CONCAT11((0 < sStack_296) *
                                                                               (sStack_296 < 0x100)
                                                                               * auVar17[2] -
                                                                               (0xff < sStack_296),
                                                                               (0 < local_298) *
                                                                               (local_298 < 0x100) *
                                                                               auVar17[0] -
                                                                               (0xff < local_298))))
                                                   ))));
          convolve_lo_y(in_stack_fffffffffffff618,in_stack_fffffffffffff610);
          convolve_hi_y(in_stack_fffffffffffff618,in_stack_fffffffffffff610);
          local_418 = (int)extraout_XMM0_Qa_04;
          iStack_414 = (int)((ulong)extraout_XMM0_Qa_04 >> 0x20);
          iStack_410 = (int)extraout_XMM0_Qb_05;
          iStack_40c = (int)((ulong)extraout_XMM0_Qb_05 >> 0x20);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = local_728;
          local_438 = (int)extraout_XMM0_Qa_05;
          iStack_434 = (int)((ulong)extraout_XMM0_Qa_05 >> 0x20);
          iStack_430 = (int)extraout_XMM0_Qb_06;
          iStack_42c = (int)((ulong)extraout_XMM0_Qb_06 >> 0x20);
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_728;
          auVar9._4_4_ = iStack_414 + 0x40 >> auVar3;
          auVar9._0_4_ = local_418 + 0x40 >> auVar3;
          auVar9._12_4_ = iStack_40c + 0x40 >> auVar3;
          auVar9._8_4_ = iStack_410 + 0x40 >> auVar3;
          auVar8._4_4_ = iStack_434 + 0x40 >> auVar17;
          auVar8._0_4_ = local_438 + 0x40 >> auVar17;
          auVar8._12_4_ = iStack_42c + 0x40 >> auVar17;
          auVar8._8_4_ = iStack_430 + 0x40 >> auVar17;
          auVar17 = packssdw(auVar9,auVar8);
          local_2b8 = auVar17._0_2_;
          sStack_2b6 = auVar17._2_2_;
          sStack_2b4 = auVar17._4_2_;
          sStack_2b2 = auVar17._6_2_;
          sStack_2b0 = auVar17._8_2_;
          sStack_2ae = auVar17._10_2_;
          sStack_2ac = auVar17._12_2_;
          sStack_2aa = auVar17._14_2_;
          *(ulong *)((long)in_RDX + (long)local_890 + (long)((local_994 + 1) * in_ECX)) =
               CONCAT17((0 < sStack_2aa) * (sStack_2aa < 0x100) * auVar17[0xe] - (0xff < sStack_2aa)
                        ,CONCAT16((0 < sStack_2ac) * (sStack_2ac < 0x100) * auVar17[0xc] -
                                  (0xff < sStack_2ac),
                                  CONCAT15((0 < sStack_2ae) * (sStack_2ae < 0x100) * auVar17[10] -
                                           (0xff < sStack_2ae),
                                           CONCAT14((0 < sStack_2b0) * (sStack_2b0 < 0x100) *
                                                    auVar17[8] - (0xff < sStack_2b0),
                                                    CONCAT13((0 < sStack_2b2) * (sStack_2b2 < 0x100)
                                                             * auVar17[6] - (0xff < sStack_2b2),
                                                             CONCAT12((0 < sStack_2b4) *
                                                                      (sStack_2b4 < 0x100) *
                                                                      auVar17[4] -
                                                                      (0xff < sStack_2b4),
                                                                      CONCAT11((0 < sStack_2b6) *
                                                                               (sStack_2b6 < 0x100)
                                                                               * auVar17[2] -
                                                                               (0xff < sStack_2b6),
                                                                               (0 < local_2b8) *
                                                                               (local_2b8 < 0x100) *
                                                                               auVar17[0] -
                                                                               (0xff < local_2b8))))
                                                   ))));
          local_994 = local_994 + 2;
        } while (local_994 < in_R9D);
        local_890 = local_890 + 8;
      } while (local_890 < in_R8D);
    }
  }
  else if (in_R8D < 8) {
    av1_convolve_y_sr_c((uint8_t *)in_stack_fffffffffffff610,
                        (int)((ulong)in_stack_fffffffffffff608 >> 0x20),in_stack_fffffffffffff600,
                        (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20),
                        (int)in_stack_fffffffffffff5f8,
                        (int)((ulong)in_stack_fffffffffffff5f0 >> 0x20),in_stack_fffffffffffff620,
                        in_stack_fffffffffffff628);
  }
  else {
    convolve_y_sr_12tap_sse2
              (in_stack_fffffffffffff7f0,(int)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
               in_stack_fffffffffffff7e0,(int)((ulong)in_stack_fffffffffffff7d8 >> 0x20),
               (int)in_stack_fffffffffffff7d8,(int)((ulong)in_stack_fffffffffffff7d0 >> 0x20),
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe78);
  }
  return;
}

Assistant:

void av1_convolve_y_sr_sse2(const uint8_t *src, int src_stride, uint8_t *dst,
                            int dst_stride, int w, int h,
                            const InterpFilterParams *filter_params_y,
                            const int subpel_y_qn) {
  if (filter_params_y->taps > 8) {
    if (w < 8) {
      av1_convolve_y_sr_c(src, src_stride, dst, dst_stride, w, h,
                          filter_params_y, subpel_y_qn);
    } else {
      convolve_y_sr_12tap_sse2(src, src_stride, dst, dst_stride, w, h,
                               filter_params_y, subpel_y_qn);
    }
  } else {
    const int fo_vert = filter_params_y->taps / 2 - 1;
    const uint8_t *src_ptr = src - fo_vert * src_stride;
    const __m128i round_const = _mm_set1_epi32((1 << FILTER_BITS) >> 1);
    const __m128i round_shift = _mm_cvtsi32_si128(FILTER_BITS);
    __m128i coeffs[4];

    prepare_coeffs(filter_params_y, subpel_y_qn, coeffs);

    if (w <= 4) {
      __m128i s[8], src6, res, res_round, res16;
      int res_int;
      s[0] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 0 * src_stride),
                               xx_loadl_32(src_ptr + 1 * src_stride));
      s[1] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 1 * src_stride),
                               xx_loadl_32(src_ptr + 2 * src_stride));
      s[2] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 2 * src_stride),
                               xx_loadl_32(src_ptr + 3 * src_stride));
      s[3] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 3 * src_stride),
                               xx_loadl_32(src_ptr + 4 * src_stride));
      s[4] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 4 * src_stride),
                               xx_loadl_32(src_ptr + 5 * src_stride));
      src6 = xx_loadl_32(src_ptr + 6 * src_stride);
      s[5] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 5 * src_stride), src6);

      do {
        s[6] = _mm_unpacklo_epi8(src6, xx_loadl_32(src_ptr + 7 * src_stride));
        src6 = xx_loadl_32(src_ptr + 8 * src_stride);
        s[7] = _mm_unpacklo_epi8(xx_loadl_32(src_ptr + 7 * src_stride), src6);

        res = convolve_lo_y(s + 0, coeffs);
        res_round = _mm_sra_epi32(_mm_add_epi32(res, round_const), round_shift);
        res16 = _mm_packs_epi32(res_round, res_round);
        res_int = _mm_cvtsi128_si32(_mm_packus_epi16(res16, res16));

        if (w == 2)
          *(uint16_t *)dst = (uint16_t)res_int;
        else
          *(int *)dst = res_int;

        src_ptr += src_stride;
        dst += dst_stride;

        res = convolve_lo_y(s + 1, coeffs);
        res_round = _mm_sra_epi32(_mm_add_epi32(res, round_const), round_shift);
        res16 = _mm_packs_epi32(res_round, res_round);
        res_int = _mm_cvtsi128_si32(_mm_packus_epi16(res16, res16));

        if (w == 2)
          *(uint16_t *)dst = (uint16_t)res_int;
        else
          *(int *)dst = res_int;

        src_ptr += src_stride;
        dst += dst_stride;

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];
        s[3] = s[5];
        s[4] = s[6];
        s[5] = s[7];
        h -= 2;
      } while (h);
    } else {
      assert(!(w % 8));
      int j = 0;
      do {
        __m128i s[8], src6, res_lo, res_hi;
        __m128i res_lo_round, res_hi_round, res16, res;
        const uint8_t *data = &src_ptr[j];

        src6 = _mm_loadl_epi64((__m128i *)(data + 6 * src_stride));
        s[0] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 0 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)));
        s[1] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 1 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)));
        s[2] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 2 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)));
        s[3] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 3 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)));
        s[4] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 4 * src_stride)),
            _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)));
        s[5] = _mm_unpacklo_epi8(
            _mm_loadl_epi64((__m128i *)(data + 5 * src_stride)), src6);

        int i = 0;
        do {
          data = &src_ptr[i * src_stride + j];
          s[6] = _mm_unpacklo_epi8(
              src6, _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)));
          src6 = _mm_loadl_epi64((__m128i *)(data + 8 * src_stride));
          s[7] = _mm_unpacklo_epi8(
              _mm_loadl_epi64((__m128i *)(data + 7 * src_stride)), src6);

          res_lo = convolve_lo_y(s, coeffs);  // Filter low index pixels
          res_hi = convolve_hi_y(s, coeffs);  // Filter high index pixels

          res_lo_round =
              _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
          res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

          res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          res = _mm_packus_epi16(res16, res16);

          _mm_storel_epi64((__m128i *)(dst + i * dst_stride + j), res);
          i++;

          res_lo = convolve_lo_y(s + 1, coeffs);  // Filter low index pixels
          res_hi = convolve_hi_y(s + 1, coeffs);  // Filter high index pixels

          res_lo_round =
              _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
          res_hi_round =
              _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

          res16 = _mm_packs_epi32(res_lo_round, res_hi_round);
          res = _mm_packus_epi16(res16, res16);

          _mm_storel_epi64((__m128i *)(dst + i * dst_stride + j), res);
          i++;

          s[0] = s[2];
          s[1] = s[3];
          s[2] = s[4];
          s[3] = s[5];
          s[4] = s[6];
          s[5] = s[7];
        } while (i < h);
        j += 8;
      } while (j < w);
    }
  }
}